

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

void __thiscall
LoopCrosser::LoopCrosser(LoopCrosser *this,S2Loop *a,S2Loop *b,LoopRelation *relation,bool swapped)

{
  int iVar1;
  bool swapped_local;
  LoopRelation *relation_local;
  S2Loop *b_local;
  S2Loop *a_local;
  LoopCrosser *this_local;
  
  this->a_ = a;
  this->b_ = b;
  this->relation_ = relation;
  this->swapped_ = swapped;
  iVar1 = (*relation->_vptr_LoopRelation[2])();
  this->a_crossing_target_ = iVar1;
  iVar1 = (*relation->_vptr_LoopRelation[3])();
  this->b_crossing_target_ = iVar1;
  S2EdgeCrosser::S2EdgeCrosser(&this->crosser_);
  S2CrossingEdgeQuery::S2CrossingEdgeQuery(&this->b_query_,&(b->index_).super_S2ShapeIndex);
  std::vector<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>::vector
            (&this->b_cells_);
  if (swapped) {
    std::swap<int>(&this->a_crossing_target_,&this->b_crossing_target_);
  }
  return;
}

Assistant:

LoopCrosser(const S2Loop& a, const S2Loop& b,
              LoopRelation* relation, bool swapped)
      : a_(a), b_(b), relation_(relation), swapped_(swapped),
        a_crossing_target_(relation->a_crossing_target()),
        b_crossing_target_(relation->b_crossing_target()),
        b_query_(&b.index_) {
    using std::swap;
    if (swapped) swap(a_crossing_target_, b_crossing_target_);
  }